

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void el::Configurations::Parser::ignoreComments(string *line)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  string local_40 [32];
  
  lVar1 = std::__cxx11::string::find((char *)line,0x1855ff);
  uVar4 = 0xffffffffffffffff;
  if (lVar1 != -1) {
    do {
      uVar2 = std::__cxx11::string::find((char *)line,0x1855ff);
      uVar4 = 0xffffffffffffffff;
      if (uVar2 == 0xffffffffffffffff) break;
      pcVar3 = (char *)std::__cxx11::string::at((ulong)line);
      uVar4 = uVar2;
    } while (*pcVar3 == '\\');
  }
  uVar2 = std::__cxx11::string::find((char *)line,0x185cbc);
  if (uVar2 != 0xffffffffffffffff) {
    if (uVar2 < uVar4) {
      std::__cxx11::string::find((char *)line,0x185cbc);
    }
    std::__cxx11::string::substr((ulong)local_40,(ulong)line);
    std::__cxx11::string::operator=((string *)line,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void Configurations::Parser::ignoreComments(std::string* line) {
  std::size_t foundAt = 0;
  std::size_t quotesStart = line->find("\"");
  std::size_t quotesEnd = std::string::npos;
  if (quotesStart != std::string::npos) {
    quotesEnd = line->find("\"", quotesStart + 1);
    while (quotesEnd != std::string::npos && line->at(quotesEnd - 1) == '\\') {
      // Do not erase slash yet - we will erase it in parseLine(..) while loop
      quotesEnd = line->find("\"", quotesEnd + 2);
    }
  }
  if ((foundAt = line->find(base::consts::kConfigurationComment)) != std::string::npos) {
    if (foundAt < quotesEnd) {
      foundAt = line->find(base::consts::kConfigurationComment, quotesEnd + 1);
    }
    *line = line->substr(0, foundAt);
  }
}